

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraphOptimizations.cpp
# Opt level: O3

void __thiscall
dg::pta::PSEquivalentNodesMerger::merge(PSEquivalentNodesMerger *this,PSNode *node1,PSNode *node2)

{
  SubgraphNode<dg::pta::PSNode> *this_00;
  PointerGraph *this_01;
  PSNode *local_38;
  PSNode *local_30;
  
  this_00 = &node1->super_SubgraphNode<dg::pta::PSNode>;
  SubgraphNode<dg::pta::PSNode>::replaceAllUsesWith(this_00,node2,true);
  this_01 = *(PointerGraph **)this;
  SubgraphNode<dg::pta::PSNode>::isolate(this_00);
  SubgraphNode<dg::pta::PSNode>::removeAllOperands(this_00);
  PointerGraph::remove(this_01,(char *)node1);
  local_38 = node2;
  local_30 = node1;
  std::
  _Hashtable<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::pta::PSNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::pta::PSNode_*>,_std::hash<dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::find((_Hashtable<dg::pta::PSNode_*,_std::pair<dg::pta::PSNode_*const,_dg::pta::PSNode_*>,_std::allocator<std::pair<dg::pta::PSNode_*const,_dg::pta::PSNode_*>_>,_std::__detail::_Select1st,_std::equal_to<dg::pta::PSNode_*>,_std::hash<dg::pta::PSNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          *)(this + 8),&local_30);
  std::
  _Hashtable<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,dg::pta::PSNode*>>,std::__detail::_Select1st,std::equal_to<dg::pta::PSNode*>,std::hash<dg::pta::PSNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<dg::pta::PSNode*&,dg::pta::PSNode*&>
            ((_Hashtable<dg::pta::PSNode*,std::pair<dg::pta::PSNode*const,dg::pta::PSNode*>,std::allocator<std::pair<dg::pta::PSNode*const,dg::pta::PSNode*>>,std::__detail::_Select1st,std::equal_to<dg::pta::PSNode*>,std::hash<dg::pta::PSNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)(this + 8),&local_30,&local_38);
  *(int *)(this + 0x40) = *(int *)(this + 0x40) + 1;
  return;
}

Assistant:

void PSEquivalentNodesMerger::merge(PSNode *node1, PSNode *node2) {
    // remove node1
    node1->replaceAllUsesWith(node2);
    removeNode(G, node1);

    // update the mapping
    mapping.add(node1, node2);

    ++merged_nodes_num;
}